

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interp.cc
# Opt level: O1

int ProgramMain(int argc,char **argv)

{
  pointer *ppMVar1;
  pointer pIVar2;
  ExternType *pEVar3;
  void *pvVar4;
  unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_> *puVar5;
  long this;
  unique_ptr<wabt::FileStream,_std::default_delete<wabt::FileStream>_> uVar6;
  undefined8 uVar7;
  undefined8 this_00;
  Result RVar8;
  int iVar9;
  wabt *this_01;
  interp *this_02;
  pointer __dest;
  Ref module_00;
  Callback *callback;
  uint uVar10;
  string *psVar11;
  Store *errors_00;
  char *pcVar12;
  bool *pbVar13;
  undefined1 auVar14 [8];
  ulong uVar15;
  size_t __n;
  pointer pIVar16;
  bool bVar17;
  string_view filename;
  string_view filename_00;
  RefVec imports;
  Ptr module;
  ReadBinaryOptions options;
  vector<unsigned_char,_std::allocator<unsigned_char>_> file_data;
  Ptr host_func;
  OptionParser parser;
  Errors errors;
  FuncType func_type;
  ModuleDesc *in_stack_fffffffffffffc60;
  vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_> local_398;
  RefPtr<wabt::interp::Module> local_378;
  _Any_data local_358;
  vector<wabt::Type,_std::allocator<wabt::Type>_> vStack_348;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_330;
  pointer local_310;
  string local_308;
  RefPtr<wabt::interp::HostFunc> local_2e8;
  undefined1 local_2c8 [8];
  Store *pSStack_2c0;
  undefined1 local_2b8 [8];
  undefined1 local_2b0 [16];
  undefined **local_2a0;
  undefined1 local_298 [16];
  undefined1 auStack_288 [16];
  undefined1 local_278 [16];
  vector<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_> local_268;
  vector<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_> local_250;
  vector<wabt::interp::TagDesc,_std::allocator<wabt::interp::TagDesc>_> vStack_238;
  vector<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_> vStack_220;
  vector<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_> vStack_208;
  vector<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_> vStack_1f0;
  vector<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_> vStack_1d8;
  Istream local_1c0;
  _Any_data local_1a8;
  code *pcStack_198;
  code *pcStack_190;
  tuple<wabt::FileStream_*,_std::default_delete<wabt::FileStream>_> local_180;
  undefined1 local_178 [16];
  pointer local_168;
  _Any_data local_158;
  undefined1 local_148 [8];
  vector<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_> local_140;
  vector<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_> local_128;
  vector<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_> local_110;
  vector<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_> local_f8;
  vector<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_> local_e0;
  vector<wabt::interp::TagDesc,_std::allocator<wabt::interp::TagDesc>_> local_c8;
  vector<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_> local_b0;
  vector<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_> local_98;
  vector<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_> local_80;
  vector<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_> vStack_68;
  pointer local_50;
  pointer puStack_48;
  pointer local_40;
  
  wabt::InitStdio();
  wabt::FileStream::CreateStdout();
  auVar14 = local_2c8;
  uVar6 = s_stdout_stream;
  local_2c8 = (undefined1  [8])0x0;
  s_stdout_stream._M_t.
  super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>._M_t.
  super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
  super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::FileStream,_std::default_delete<wabt::FileStream>,_true,_true>)
       (__uniq_ptr_data<wabt::FileStream,_std::default_delete<wabt::FileStream>,_true,_true>)auVar14
  ;
  if ((__uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>)
      uVar6._M_t.super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>.
      _M_t.super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
      super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>)0x0) {
    (**(code **)(*(long *)uVar6._M_t.
                          super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>
                          .super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl + 8))();
  }
  if (local_2c8 != (undefined1  [8])0x0) {
    (*((Stream *)local_2c8)->_vptr_Stream[1])();
  }
  wabt::FileStream::CreateStderr();
  auVar14 = local_2c8;
  uVar6 = s_stderr_stream;
  local_2c8 = (undefined1  [8])0x0;
  s_stderr_stream._M_t.
  super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>._M_t.
  super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
  super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::FileStream,_std::default_delete<wabt::FileStream>,_true,_true>)
       (__uniq_ptr_data<wabt::FileStream,_std::default_delete<wabt::FileStream>,_true,_true>)auVar14
  ;
  if ((__uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>)
      uVar6._M_t.super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>.
      _M_t.super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
      super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>)0x0) {
    (**(code **)(*(long *)uVar6._M_t.
                          super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>
                          .super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl + 8))();
  }
  if (local_2c8 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)local_2c8 + 8))();
  }
  wabt::OptionParser::OptionParser
            ((OptionParser *)local_2c8,"wasm-interp",
             "  read a file in the wasm binary format, and run in it a stack-based\n  interpreter.\n\nexamples:\n  # parse binary file test.wasm, and type-check it\n  $ wasm-interp test.wasm\n\n  # parse test.wasm and run all its exported functions\n  $ wasm-interp test.wasm --run-all-exports\n\n  # parse test.wasm, run the exported functions and trace the output\n  $ wasm-interp test.wasm --run-all-exports --trace\n\n  # parse test.wasm and run all its exported functions, setting the\n  # value stack size to 100 elements\n  $ wasm-interp test.wasm -V 100 --run-all-exports\n\n  # parse test.wasm, run specific exported function by name with argument\n  $ wasm-interp test.wasm -r \"func_sum\" -a \"i32:8\" -a \"i32:5\"\n"
            );
  local_158._M_unused._M_object = (void *)0x0;
  local_158._8_8_ = 0;
  local_140.super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:139:72)>
                ::_M_invoke;
  local_148 = (undefined1  [8])
              std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:139:72)>
              ::_M_manager;
  wabt::OptionParser::AddOption
            ((OptionParser *)local_2c8,'v',"verbose","Use multiple times for more info",
             (NullCallback *)&local_158);
  if (local_148 != (undefined1  [8])0x0) {
    (*(code *)local_148)(&local_158,&local_158,3);
  }
  wabt::Features::AddOptions(&s_features,(OptionParser *)local_2c8);
  local_158._M_unused._M_object = (void *)0x0;
  local_158._8_8_ = 0;
  local_140.super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:146:20)>
                ::_M_invoke;
  local_148 = (undefined1  [8])
              std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:146:20)>
              ::_M_manager;
  wabt::OptionParser::AddOption
            ((OptionParser *)local_2c8,'V',"value-stack-size","SIZE",
             "Size in elements of the value stack",(Callback *)&local_158);
  if (local_148 != (undefined1  [8])0x0) {
    (*(code *)local_148)(&local_158,&local_158,3);
  }
  local_158._M_unused._M_object = (void *)0x0;
  local_158._8_8_ = 0;
  local_140.super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:152:20)>
                ::_M_invoke;
  local_148 = (undefined1  [8])
              std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:152:20)>
              ::_M_manager;
  wabt::OptionParser::AddOption
            ((OptionParser *)local_2c8,'C',"call-stack-size","SIZE",
             "Size in elements of the call stack",(Callback *)&local_158);
  if (local_148 != (undefined1  [8])0x0) {
    (*(code *)local_148)(&local_158,&local_158,3);
  }
  local_158._M_unused._M_object = (void *)0x0;
  local_158._8_8_ = 0;
  local_140.super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:157:20)>
                ::_M_invoke;
  local_148 = (undefined1  [8])
              std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:157:20)>
              ::_M_manager;
  wabt::OptionParser::AddOption
            ((OptionParser *)local_2c8,'t',"trace","Trace execution",(NullCallback *)&local_158);
  if (local_148 != (undefined1  [8])0x0) {
    (*(code *)local_148)(&local_158,&local_158,3);
  }
  local_158._M_unused._M_object = (void *)0x0;
  local_158._8_8_ = 0;
  local_140.super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:160:20)>
                ::_M_invoke;
  local_148 = (undefined1  [8])
              std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:160:20)>
              ::_M_manager;
  wabt::OptionParser::AddOption
            ((OptionParser *)local_2c8,'r',"run-export","FUNCTION","Run exported function by name",
             (Callback *)&local_158);
  if (local_148 != (undefined1  [8])0x0) {
    (*(code *)local_148)(&local_158,&local_158,3);
  }
  local_158._M_unused._M_object = (void *)0x0;
  local_158._8_8_ = 0;
  local_140.super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:167:20)>
                ::_M_invoke;
  local_148 = (undefined1  [8])
              std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:167:20)>
              ::_M_manager;
  wabt::OptionParser::AddOption
            ((OptionParser *)local_2c8,'a',"argument","ARGUMENT",
             "Add argument to an exported function execution",(Callback *)&local_158);
  if (local_148 != (undefined1  [8])0x0) {
    (*(code *)local_148)(&local_158,&local_158,3);
  }
  local_158._M_unused._M_object = (void *)0x0;
  local_158._8_8_ = 0;
  local_140.super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:181:20)>
                ::_M_invoke;
  local_148 = (undefined1  [8])
              std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:181:20)>
              ::_M_manager;
  wabt::OptionParser::AddOption
            ((OptionParser *)local_2c8,"wasi",
             "Assume input module is WASI compliant (Export  WASI API the the module and invoke _start function)"
             ,(NullCallback *)&local_158);
  if (local_148 != (undefined1  [8])0x0) {
    (*(code *)local_148)(&local_158,&local_158,3);
  }
  local_158._M_unused._M_object = (void *)0x0;
  local_158._8_8_ = 0;
  local_140.super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:185:7)>
                ::_M_invoke;
  local_148 = (undefined1  [8])
              std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:185:7)>
              ::_M_manager;
  wabt::OptionParser::AddOption
            ((OptionParser *)local_2c8,'e',"env","ENV",
             "Pass the given environment string in the WASI runtime",(Callback *)&local_158);
  if (local_148 != (undefined1  [8])0x0) {
    (*(code *)local_148)(&local_158,&local_158,3);
  }
  local_158._M_unused._M_object = (void *)0x0;
  local_158._8_8_ = 0;
  local_140.super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:188:7)>
                ::_M_invoke;
  local_148 = (undefined1  [8])
              std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:188:7)>
              ::_M_manager;
  wabt::OptionParser::AddOption
            ((OptionParser *)local_2c8,'d',"dir","DIR",
             "Pass the given directory the the WASI runtime",(Callback *)&local_158);
  if (local_148 != (undefined1  [8])0x0) {
    (*(code *)local_148)(&local_158,&local_158,3);
  }
  local_158._M_unused._M_object = (void *)0x0;
  local_158._8_8_ = 0;
  local_140.super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:192:7)>
                ::_M_invoke;
  local_148 = (undefined1  [8])
              std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:192:7)>
              ::_M_manager;
  wabt::OptionParser::AddOption
            ((OptionParser *)local_2c8,"run-all-exports",
             "Run all the exported functions, in order. Useful for testing",
             (NullCallback *)&local_158);
  if (local_148 != (undefined1  [8])0x0) {
    (*(code *)local_148)(&local_158,&local_158,3);
  }
  local_158._M_unused._M_object = (void *)0x0;
  local_158._8_8_ = 0;
  local_140.super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:196:20)>
                ::_M_invoke;
  local_148 = (undefined1  [8])
              std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:196:20)>
              ::_M_manager;
  wabt::OptionParser::AddOption
            ((OptionParser *)local_2c8,"host-print",
             "Include an importable function named \"host.print\" for printing to stdout",
             (NullCallback *)&local_158);
  if (local_148 != (undefined1  [8])0x0) {
    (*(code *)local_148)(&local_158,&local_158,3);
  }
  local_158._M_unused._M_object = (void *)0x0;
  local_158._8_8_ = 0;
  local_140.super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:201:7)>
                ::_M_invoke;
  local_148 = (undefined1  [8])
              std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:201:7)>
              ::_M_manager;
  wabt::OptionParser::AddOption
            ((OptionParser *)local_2c8,"dummy-import-func",
             "Provide a dummy implementation of all imported functions. The function will log the call and return an appropriate zero value."
             ,(NullCallback *)&local_158);
  if (local_148 != (undefined1  [8])0x0) {
    (*(code *)local_148)(&local_158,&local_158,3);
  }
  local_148 = (undefined1  [8])0x656d616e656c6966;
  local_158._8_8_ = 8;
  local_140.super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)local_140.
                        super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>
                        ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  local_358._M_unused._M_object = (void *)0x0;
  local_358._8_4_ = 0;
  local_358._12_4_ = 0;
  vStack_348.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:204:22)>
                ::_M_invoke;
  vStack_348.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start._0_3_ = 0x112f86;
  vStack_348.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start._3_5_ = 0;
  local_158._M_unused._M_object = local_148;
  wabt::OptionParser::AddArgument
            ((OptionParser *)local_2c8,(string *)&local_158,One,(Callback *)&local_358);
  if ((code *)CONCAT53(vStack_348.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                       _M_impl.super__Vector_impl_data._M_start._3_5_,
                       vStack_348.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                       _M_impl.super__Vector_impl_data._M_start._0_3_) != (code *)0x0) {
    (*(code *)CONCAT53(vStack_348.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                       _M_impl.super__Vector_impl_data._M_start._3_5_,
                       vStack_348.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                       _M_impl.super__Vector_impl_data._M_start._0_3_))(&local_358,&local_358,3);
  }
  if ((undefined1 *)local_158._M_unused._0_8_ != local_148) {
    operator_delete(local_158._M_unused._M_object,(ulong)((long)local_148 + 1));
  }
  local_148._0_4_ = 0x677261;
  local_158._8_8_ = (Store *)0x3;
  callback = (Callback *)&local_358;
  local_358._M_unused._M_object = (undefined **)0x0;
  local_358._8_4_ = 0;
  local_358._12_4_ = 0;
  vStack_348.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:207:7)>
                ::_M_invoke;
  vStack_348.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start._0_3_ = 0x112fe8;
  vStack_348.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start._3_5_ = 0;
  local_158._M_unused._M_object = local_148;
  wabt::OptionParser::AddArgument
            ((OptionParser *)local_2c8,(string *)&local_158,ZeroOrMore,callback);
  if ((code *)CONCAT53(vStack_348.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                       _M_impl.super__Vector_impl_data._M_start._3_5_,
                       vStack_348.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                       _M_impl.super__Vector_impl_data._M_start._0_3_) != (code *)0x0) {
    (*(code *)CONCAT53(vStack_348.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                       _M_impl.super__Vector_impl_data._M_start._3_5_,
                       vStack_348.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                       _M_impl.super__Vector_impl_data._M_start._0_3_))(&local_358,&local_358,3);
  }
  if ((undefined1 *)local_158._M_unused._0_8_ != local_148) {
    operator_delete(local_158._M_unused._M_object,(ulong)((long)local_148 + 1));
  }
  wabt::OptionParser::Parse((OptionParser *)local_2c8,argc,argv);
  if (local_250.
      super__Vector_base<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>.
      _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    ppMVar1 = &local_268.
               super__Vector_base<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (*(code *)local_250.
              super__Vector_base<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>
              ._M_impl.super__Vector_impl_data._M_finish)(ppMVar1,ppMVar1,3);
  }
  std::vector<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>::~vector
            ((vector<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_> *)
             (local_278 + 8));
  std::vector<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>::~vector
            ((vector<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_> *)
             auStack_288);
  if ((undefined1 *)local_2b0._8_8_ != local_298) {
    operator_delete((void *)local_2b0._8_8_,CONCAT44(local_298._4_4_,local_298._0_4_) + 1);
  }
  if (local_2c8 != (undefined1  [8])local_2b8) {
    operator_delete((void *)local_2c8,(ulong)((long)local_2b8 + 1));
  }
  pcVar12 = s_infile;
  uVar6._M_t.super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>._M_t.
  super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
  super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl =
       s_stdout_stream._M_t.
       super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>._M_t.
       super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
       super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl;
  s_store.features_.exceptions_enabled_ = s_features.exceptions_enabled_;
  s_store.features_.mutable_globals_enabled_ = s_features.mutable_globals_enabled_;
  s_store.features_.sat_float_to_int_enabled_ = s_features.sat_float_to_int_enabled_;
  s_store.features_.sign_extension_enabled_ = s_features.sign_extension_enabled_;
  s_store.features_.simd_enabled_ = s_features.simd_enabled_;
  s_store.features_.threads_enabled_ = s_features.threads_enabled_;
  s_store.features_.function_references_enabled_ = s_features.function_references_enabled_;
  s_store.features_.multi_value_enabled_ = s_features.multi_value_enabled_;
  s_store.features_.tail_call_enabled_ = s_features.tail_call_enabled_;
  s_store.features_.bulk_memory_enabled_ = s_features.bulk_memory_enabled_;
  s_store.features_.reference_types_enabled_ = s_features.reference_types_enabled_;
  s_store.features_.annotations_enabled_ = s_features.annotations_enabled_;
  s_store.features_.code_metadata_enabled_ = s_features.code_metadata_enabled_;
  s_store.features_.gc_enabled_ = s_features.gc_enabled_;
  s_store.features_.memory64_enabled_ = s_features.memory64_enabled_;
  s_store.features_.multi_memory_enabled_ = s_features.multi_memory_enabled_;
  s_store.features_.extended_const_enabled_ = s_features.extended_const_enabled_;
  s_store.features_.relaxed_simd_enabled_ = s_features.relaxed_simd_enabled_;
  s_store.features_.custom_page_sizes_enabled_ = s_features.custom_page_sizes_enabled_;
  bVar17 = false;
  local_168 = (pointer)0x0;
  local_178._0_8_ = (pointer)0x0;
  local_178._8_8_ = (pointer)0x0;
  local_378.root_index_ = 0;
  local_378.obj_ = (Module *)0x0;
  local_378.store_ = (Store *)0x0;
  local_308.field_2._M_allocated_capacity = 0;
  local_308._M_dataplus._M_p = (char *)0x0;
  local_308._M_string_length = 0;
  this_01 = (wabt *)strlen(s_infile);
  filename._M_str = (char *)&local_308;
  filename._M_len = (size_t)pcVar12;
  RVar8 = wabt::ReadFile(this_01,filename,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)callback);
  if (RVar8.enum_ != Error) {
    memset((OptionParser *)local_2c8,0,0x120);
    local_358._M_unused._M_object = (void *)s_features._0_8_;
    local_358._8_4_ = s_features._8_4_;
    local_358._M_pod_data[0xf] = s_features.multi_memory_enabled_;
    local_358._12_3_ = s_features._12_3_;
    vStack_348.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_start._0_3_ = s_features._16_3_;
    vStack_348.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)s_log_stream._M_t.
                  super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>
                  .super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl;
    vStack_348.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 0x10101;
    this_02 = (interp *)strlen(pcVar12);
    filename_00._M_str = local_308._M_dataplus._M_p;
    filename_00._M_len = (size_t)pcVar12;
    RVar8 = wabt::interp::ReadBinaryInterp
                      (this_02,filename_00,
                       (void *)(local_308._M_string_length - (long)local_308._M_dataplus._M_p),
                       (size_t)&local_358,(ReadBinaryOptions *)local_178,(Errors *)local_2c8,
                       in_stack_fffffffffffffc60);
    bVar17 = RVar8.enum_ != Error;
    if (bVar17) {
      if (s_verbose != 0) {
        wabt::interp::Istream::Disassemble
                  (&local_1c0,
                   (Stream *)
                   uVar6._M_t.
                   super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>
                   .super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl);
      }
      std::vector<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>::vector
                ((vector<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_> *)
                 &local_158,
                 (vector<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_> *)
                 local_2c8);
      std::vector<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>::vector
                ((vector<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_> *)
                 (local_148 + 8),
                 (vector<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_> *)
                 local_2b0);
      std::vector<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>::vector
                (&local_128,
                 (vector<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_> *)
                 local_298);
      std::vector<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_>::vector
                (&local_110,
                 (vector<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_> *)
                 (auStack_288 + 8));
      std::vector<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>::vector
                (&local_f8,&local_268);
      std::vector<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>::vector
                (&local_e0,&local_250);
      std::vector<wabt::interp::TagDesc,_std::allocator<wabt::interp::TagDesc>_>::vector
                (&local_c8,&vStack_238);
      std::vector<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>::vector
                (&local_b0,&vStack_220);
      std::vector<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_>::vector
                (&local_98,&vStack_208);
      std::vector<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>::vector
                (&local_80,&vStack_1f0);
      std::vector<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_>::vector
                (&vStack_68,&vStack_1d8);
      local_50 = (pointer)0x0;
      puStack_48 = (pointer)0x0;
      local_40 = (pointer)0x0;
      uVar15 = (long)local_1c0.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_1c0.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
      if (uVar15 == 0) {
        __dest = (pointer)0x0;
      }
      else {
        if ((long)uVar15 < 0) {
          std::__throw_bad_alloc();
        }
        __dest = (pointer)operator_new(uVar15);
      }
      local_40 = __dest + uVar15;
      __n = (long)local_1c0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_1c0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      local_50 = __dest;
      if (__n != 0) {
        puStack_48 = __dest;
        memmove(__dest,local_1c0.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start,__n);
      }
      puStack_48 = __dest + __n;
      wabt::interp::Store::Alloc<wabt::interp::Module,wabt::interp::Store&,wabt::interp::ModuleDesc>
                ((RefPtr<wabt::interp::Module> *)&local_1a8,&s_store,&s_store,
                 (ModuleDesc *)&local_158);
      local_378.obj_ = (Module *)local_1a8._M_unused._0_8_;
      local_378.store_ = (Store *)local_1a8._8_8_;
      local_378.root_index_ = (Index)pcStack_198;
      local_1a8._M_unused._M_object = (undefined8 *)0x0;
      local_1a8._8_8_ = (Store *)0x0;
      pcStack_198 = (code *)0x0;
      wabt::interp::ModuleDesc::~ModuleDesc((ModuleDesc *)&local_158);
    }
    wabt::interp::ModuleDesc::~ModuleDesc((ModuleDesc *)local_2c8);
  }
  if (local_308._M_dataplus._M_p != (char *)0x0) {
    operator_delete(local_308._M_dataplus._M_p,
                    local_308.field_2._M_allocated_capacity - (long)local_308._M_dataplus._M_p);
  }
  if (bVar17) {
    local_398.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_398.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
    super__Vector_impl_data._M_finish = (Ref *)0x0;
    local_398.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (Ref *)0x0;
    if (s_wasi == '\x01') {
      wabt::Stream::Writef
                ((Stream *)
                 s_stderr_stream._M_t.
                 super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
                 super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl,
                 "wasi support not compiled in\n");
      uVar10 = 1;
    }
    else {
      pIVar2 = ((local_378.obj_)->desc_).imports.
               super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pIVar16 = ((local_378.obj_)->desc_).imports.
                super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (pIVar2 != pIVar16) {
        local_180.super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>
        .super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl =
             (_Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>)
             (_Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>)
             s_stdout_stream._M_t.
             super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>._M_t.
             super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
             super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl;
        psVar11 = &(pIVar2->type).name;
        local_310 = pIVar16;
        do {
          if (((((unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
                  *)(psVar11 + 1))->_M_t).
               super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
               ._M_t.
               super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
               .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl)->kind ==
              First) {
            if (s_host_print == '\x01') {
              iVar9 = std::__cxx11::string::compare((char *)(psVar11 + -1));
              if (iVar9 != 0) goto LAB_00112504;
              iVar9 = std::__cxx11::string::compare((char *)psVar11);
              if (iVar9 != 0) goto LAB_00112504;
            }
            else {
LAB_00112504:
              if (s_dummy_import_func != '\x01') goto LAB_00112678;
            }
            pEVar3 = (((unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
                        *)(psVar11 + 1))->_M_t).
                     super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
                     .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl;
            if (pEVar3->kind != First) {
              __assert_fail("isa<Derived>(base)",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/cast.h"
                            ,0x4e,
                            "Derived *wabt::cast(Base *) [Derived = wabt::interp::FuncType, Base = wabt::interp::ExternType]"
                           );
            }
            local_158._8_8_ = local_158._8_8_ & 0xffffffff00000000;
            local_158._M_unused._M_object = &PTR__FuncType_001880d0;
            std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
                      ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)local_148,
                       (vector<wabt::Type,_std::allocator<wabt::Type>_> *)(pEVar3 + 1));
            this = (long)&local_140.
                          super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage;
            std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
                      ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)this,
                       (vector<wabt::Type,_std::allocator<wabt::Type>_> *)&pEVar3[2].kind);
            wabt::StringPrintf_abi_cxx11_
                      (&local_308,"%s.%s",(((ImportType *)(psVar11 + -1))->module)._M_dataplus._M_p,
                       (psVar11->_M_dataplus)._M_p);
            local_358._8_4_ = local_158._8_4_;
            local_358._M_unused._M_object = &PTR__FuncType_001880d0;
            std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
                      (&vStack_348,(vector<wabt::Type,_std::allocator<wabt::Type>_> *)local_148);
            std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
                      (&local_330,(vector<wabt::Type,_std::allocator<wabt::Type>_> *)this);
            local_2c8 = (undefined1  [8])
                        local_180.
                        super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>
                        .super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl;
            pSStack_2c0 = (Store *)local_2b0;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&pSStack_2c0,local_308._M_dataplus._M_p,
                       local_308._M_dataplus._M_p + local_308._M_string_length);
            local_298._0_4_ = local_158._8_4_;
            local_2a0 = &PTR__FuncType_001880d0;
            std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
                      ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)(local_298 + 8),
                       (vector<wabt::Type,_std::allocator<wabt::Type>_> *)local_148);
            std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
                      ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)local_278,
                       (vector<wabt::Type,_std::allocator<wabt::Type>_> *)
                       &local_140.
                        super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            pcStack_198 = (code *)0x0;
            pcStack_190 = (code *)0x0;
            local_1a8._M_unused._M_object = (void *)0x0;
            local_1a8._8_8_ = (Store *)0x0;
            local_1a8._M_unused._M_object = operator_new(0x68);
            pIVar16 = local_310;
            *(undefined1 (*) [8])local_1a8._M_unused._0_8_ = local_2c8;
            *(code **)((long)local_1a8._M_unused._0_8_ + 8) =
                 (code *)((long)local_1a8._M_unused._0_8_ + 0x18);
            if (pSStack_2c0 == (Store *)local_2b0) {
              *(ulong *)((long)local_1a8._M_unused._0_8_ + 0x18) =
                   CONCAT71(local_2b0._1_7_,local_2b0[0]);
              *(undefined8 *)((long)local_1a8._M_unused._0_8_ + 0x20) = local_2b0._8_8_;
            }
            else {
              *(Store **)((long)local_1a8._M_unused._0_8_ + 8) = pSStack_2c0;
              *(ulong *)((long)local_1a8._M_unused._0_8_ + 0x18) =
                   CONCAT71(local_2b0._1_7_,local_2b0[0]);
            }
            *(undefined1 (*) [8])((long)local_1a8._M_unused._0_8_ + 0x10) = local_2b8;
            local_2b8 = (undefined1  [8])0x0;
            local_2b0[0] = '\0';
            *(undefined ***)((long)local_1a8._M_unused._0_8_ + 0x28) = &PTR__ExternType_00186c90;
            *(undefined4 *)((long)local_1a8._M_unused._0_8_ + 0x30) = local_298._0_4_;
            *(undefined ***)((long)local_1a8._M_unused._0_8_ + 0x28) = &PTR__FuncType_001880d0;
            *(undefined8 *)((long)local_1a8._M_unused._0_8_ + 0x38) = local_298._8_8_;
            *(undefined8 *)((long)local_1a8._M_unused._0_8_ + 0x40) = auStack_288._0_8_;
            *(undefined8 *)((long)local_1a8._M_unused._0_8_ + 0x48) = auStack_288._8_8_;
            auStack_288._8_8_ = (pointer)0x0;
            local_298._8_8_ = (void *)0x0;
            auStack_288._0_8_ = (pointer)0x0;
            *(undefined8 *)((long)local_1a8._M_unused._0_8_ + 0x50) = local_278._0_8_;
            *(undefined8 *)((long)local_1a8._M_unused._0_8_ + 0x58) = local_278._8_8_;
            *(pointer *)((long)local_1a8._M_unused._0_8_ + 0x60) =
                 local_268.
                 super__Vector_base<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_268.
            super__Vector_base<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_278._0_8_ = (pointer)0x0;
            local_278._8_8_ = (pointer)0x0;
            pcStack_190 = std::
                          _Function_handler<wabt::Result_(wabt::interp::Thread_&,_const_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_wabt::interp::RefPtr<wabt::interp::Trap>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:295:11)>
                          ::_M_invoke;
            pcStack_198 = std::
                          _Function_handler<wabt::Result_(wabt::interp::Thread_&,_const_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_wabt::interp::RefPtr<wabt::interp::Trap>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm-interp.cc:295:11)>
                          ::_M_manager;
            pSStack_2c0 = (Store *)local_2b0;
            wabt::interp::Store::
            Alloc<wabt::interp::HostFunc,wabt::interp::Store&,wabt::interp::FuncType&,std::function<wabt::Result(wabt::interp::Thread&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>const&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>&,wabt::interp::RefPtr<wabt::interp::Trap>*)>&>
                      (&local_2e8,&s_store,&s_store,(FuncType *)&local_358,
                       (function<wabt::Result_(wabt::interp::Thread_&,_const_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_wabt::interp::RefPtr<wabt::interp::Trap>_*)>
                        *)&local_1a8);
            if (pcStack_198 != (code *)0x0) {
              (*pcStack_198)(&local_1a8,&local_1a8,__destroy_functor);
            }
            local_2a0 = &PTR__FuncType_001880d0;
            if ((pointer)local_278._0_8_ != (pointer)0x0) {
              operator_delete((void *)local_278._0_8_,
                              (long)local_268.
                                    super__Vector_base<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>
                                    ._M_impl.super__Vector_impl_data._M_start - local_278._0_8_);
            }
            if ((void *)local_298._8_8_ != (void *)0x0) {
              operator_delete((void *)local_298._8_8_,auStack_288._8_8_ - local_298._8_8_);
            }
            if (pSStack_2c0 != (Store *)local_2b0) {
              operator_delete(pSStack_2c0,CONCAT71(local_2b0._1_7_,local_2b0[0]) + 1);
            }
            local_358._M_unused._M_object = &PTR__FuncType_001880d0;
            if (local_330.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_330.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_330.
                                    super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_330.
                                    super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            pvVar4 = (void *)CONCAT53(vStack_348.
                                      super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                      _M_impl.super__Vector_impl_data._M_start._3_5_,
                                      vStack_348.
                                      super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                      _M_impl.super__Vector_impl_data._M_start._0_3_);
            if (pvVar4 != (void *)0x0) {
              operator_delete(pvVar4,CONCAT44(vStack_348.
                                              super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage.
                                              _4_4_,vStack_348.
                                                                                                        
                                                  super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._0_4_) - (long)pvVar4);
            }
            local_2c8 = (undefined1  [8])
                        wabt::interp::RefPtr<wabt::interp::HostFunc>::ref(&local_2e8);
            if (local_398.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                local_398.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::
              _M_realloc_insert<wabt::interp::Ref>
                        (&local_398,
                         (iterator)
                         local_398.
                         super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                         _M_impl.super__Vector_impl_data._M_finish,(Ref *)local_2c8);
            }
            else {
              (local_398.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
               _M_impl.super__Vector_impl_data._M_finish)->index = (size_t)local_2c8;
              local_398.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   local_398.
                   super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl
                   .super__Vector_impl_data._M_finish + 1;
            }
            if (local_2e8.obj_ != (HostFunc *)0x0) {
              wabt::interp::Store::DeleteRoot(local_2e8.store_,local_2e8.root_index_);
              local_2e8.obj_ = (HostFunc *)0x0;
              local_2e8.store_ = (Store *)0x0;
              local_2e8.root_index_ = 0;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_308._M_dataplus._M_p != &local_308.field_2) {
              operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1
                             );
            }
            local_158._M_unused._M_object = &PTR__FuncType_001880d0;
            if (local_140.
                super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
              operator_delete(local_140.
                              super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (long)local_128.
                                    super__Vector_base<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_140.
                                    super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
            }
            if (local_148 != (undefined1  [8])0x0) {
              operator_delete((void *)local_148,
                              (long)local_140.
                                    super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)local_148);
            }
          }
          else {
LAB_00112678:
            if (local_398.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                local_398.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>>::
              _M_realloc_insert<wabt::interp::Ref_const&>
                        ((vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>> *)&local_398,
                         (iterator)
                         local_398.
                         super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                         _M_impl.super__Vector_impl_data._M_finish,(Ref *)&wabt::interp::Ref::Null);
            }
            else {
              (local_398.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
               _M_impl.super__Vector_impl_data._M_finish)->index = 0;
              local_398.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   local_398.
                   super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl
                   .super__Vector_impl_data._M_finish + 1;
            }
          }
          puVar5 = (unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
                    *)(psVar11 + 1);
          psVar11 = (string *)((long)(psVar11 + 2) + 8);
        } while ((pointer)(puVar5 + 1) != pIVar16);
      }
      vStack_348.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start._0_3_ = 0;
      vStack_348.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start._3_5_ = 0;
      local_358._M_unused._M_object = (void *)0x0;
      local_358._8_4_ = 0;
      local_358._12_4_ = 0;
      local_2b8 = (undefined1  [8])0x0;
      local_2c8 = (undefined1  [8])0x0;
      pSStack_2c0 = (Store *)0x0;
      module_00 = wabt::interp::RefPtr<wabt::interp::Module>::ref(&local_378);
      errors_00 = &s_store;
      wabt::interp::Instance::Instantiate
                ((Ptr *)&local_158,&s_store,module_00,&local_398,(Ptr *)local_2c8);
      auVar14 = local_148;
      this_00 = local_158._8_8_;
      uVar7 = local_158._M_unused._0_8_;
      local_358._M_unused._M_object = local_158._M_unused._M_object;
      local_358._8_4_ = (undefined4)local_158._8_8_;
      local_358._12_4_ = (undefined4)((ulong)local_158._8_8_ >> 0x20);
      vStack_348.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start._0_3_ = local_148._0_3_;
      vStack_348.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start._3_5_ = local_148._3_5_;
      if ((undefined **)local_158._M_unused._0_8_ == (undefined **)0x0) {
        pcVar12 = "error initializing module";
        wabt::interp::WriteTrap
                  ((Stream *)
                   s_stderr_stream._M_t.
                   super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>
                   .super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl,
                   "error initializing module",(Ptr *)local_2c8);
        errors_00 = (Store *)pcVar12;
      }
      if (local_2c8 != (undefined1  [8])0x0) {
        errors_00 = (Store *)local_2b8;
        wabt::interp::Store::DeleteRoot(pSStack_2c0,(Index)local_2b8);
        local_2c8 = (undefined1  [8])0x0;
        pSStack_2c0 = (Store *)0x0;
        local_2b8 = (undefined1  [8])0x0;
      }
      if ((undefined **)uVar7 != (undefined **)0x0) {
        if (s_run_all_exports == '\x01') {
          RunAllExports((Ptr *)&local_358,(Errors *)errors_00);
        }
        if (s_run_exports.super__Vector_base<FunctionCall,_std::allocator<FunctionCall>_>._M_impl.
            super__Vector_impl_data._M_start !=
            s_run_exports.super__Vector_base<FunctionCall,_std::allocator<FunctionCall>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          RunSpecificExports((Ptr *)&local_358,(Errors *)errors_00,&s_run_exports);
        }
        if ((undefined **)uVar7 != (undefined **)0x0) {
          wabt::interp::Store::DeleteRoot((Store *)this_00,(Index)auVar14);
          local_358._M_unused._M_object = (undefined **)0x0;
          local_358._8_4_ = 0;
          local_358._12_4_ = 0;
          vStack_348.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
          super__Vector_impl_data._M_start._0_3_ = 0;
          vStack_348.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
          super__Vector_impl_data._M_start._3_5_ = 0;
        }
      }
      uVar10 = (uint)((undefined **)uVar7 == (undefined **)0x0);
    }
    if (local_398.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) goto LAB_00112a8b;
    pbVar13 = (bool *)((long)local_398.
                             super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_398.
                            super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    auVar14 = (undefined1  [8])
              local_398.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
              _M_impl.super__Vector_impl_data._M_start;
  }
  else {
    pSStack_2c0 = (Store *)0x0;
    local_2b8 = (undefined1  [8])((ulong)local_2b8 & 0xffffffffffffff00);
    uVar10 = 1;
    local_2c8 = (undefined1  [8])local_2b8;
    wabt::FormatErrorsToFile
              ((Errors *)local_178,Binary,(LexerSourceLineFinder *)0x0,_stderr,(string *)local_2c8,
               Never,0x50);
    if (local_2c8 == (undefined1  [8])local_2b8) goto LAB_00112a8b;
    pbVar13 = (bool *)((long)local_2b8 + 1);
    auVar14 = local_2c8;
    uVar10 = 1;
  }
  operator_delete((void *)auVar14,(ulong)pbVar13);
LAB_00112a8b:
  if (local_378.obj_ != (Module *)0x0) {
    wabt::interp::Store::DeleteRoot(local_378.store_,local_378.root_index_);
    local_378.obj_ = (Module *)0x0;
    local_378.store_ = (Store *)0x0;
    local_378.root_index_ = 0;
  }
  std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector
            ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)local_178);
  return uVar10;
}

Assistant:

int ProgramMain(int argc, char** argv) {
  InitStdio();
  s_stdout_stream = FileStream::CreateStdout();
  s_stderr_stream = FileStream::CreateStderr();

  ParseOptions(argc, argv);
  s_store.setFeatures(s_features);

  wabt::Result result = ReadAndRunModule(s_infile);
  return result != wabt::Result::Ok;
}